

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::concat<kj::StringTree>(String *__return_storage_ptr__,_ *this,StringTree *params)

{
  size_t size;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)this;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x1;
  size = sum((_ *)&local_18,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<>(target,(StringTree *)this);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}